

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

int template_match(t_template *x1,t_template *x2)

{
  int iVar1;
  int local_24;
  int i;
  t_template *x2_local;
  t_template *x1_local;
  
  if (x1->t_n < x2->t_n) {
    x1_local._4_4_ = 0;
  }
  else {
    for (local_24 = x2->t_n; local_24 < x1->t_n; local_24 = local_24 + 1) {
      if (x1->t_vec[local_24].ds_type == 3) {
        return 0;
      }
    }
    if (x1->t_n < x2->t_n) {
      post("add elements...");
    }
    for (local_24 = 0; local_24 < x2->t_n; local_24 = local_24 + 1) {
      iVar1 = dataslot_matches(x1->t_vec + local_24,x2->t_vec + local_24,1);
      if (iVar1 == 0) {
        return 0;
      }
    }
    x1_local._4_4_ = 1;
  }
  return x1_local._4_4_;
}

Assistant:

int template_match(t_template *x1, t_template *x2)
{
    int i;
    if (x1->t_n < x2->t_n)
        return (0);
    for (i = x2->t_n; i < x1->t_n; i++)
    {
        if (x1->t_vec[i].ds_type == DT_ARRAY)
                return (0);
    }
    if (x2->t_n > x1->t_n)
        post("add elements...");
    for (i = 0; i < x2->t_n; i++)
        if (!dataslot_matches(&x1->t_vec[i], &x2->t_vec[i], 1))
            return (0);
    return (1);
}